

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  Solver *this_local;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0013ec30;
  vec<Minisat::Lit,_int>::~vec(&this->add_tmp);
  vec<Minisat::Lit,_int>::~vec(&this->analyze_toclear);
  vec<Minisat::Solver::ShrinkStackElem,_int>::~vec(&this->analyze_stack);
  VMap<char>::~VMap(&this->seen);
  vec<int,_int>::~vec(&this->free_vars);
  vec<int,_int>::~vec(&this->released_vars);
  ClauseAllocator::~ClauseAllocator(&this->ca);
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::~Heap(&this->order_heap);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::~OccLists(&this->watches);
  VMap<Minisat::Solver::VarData>::~VMap(&this->vardata);
  VMap<char>::~VMap(&this->decision);
  VMap<Minisat::lbool>::~VMap(&this->user_pol);
  VMap<char>::~VMap(&this->polarity);
  VMap<Minisat::lbool>::~VMap(&this->assigns);
  VMap<double>::~VMap(&this->activity);
  vec<Minisat::Lit,_int>::~vec(&this->assumptions);
  vec<int,_int>::~vec(&this->trail_lim);
  vec<Minisat::Lit,_int>::~vec(&this->trail);
  vec<unsigned_int,_int>::~vec(&this->learnts);
  vec<unsigned_int,_int>::~vec(&this->clauses);
  LSet::~LSet(&this->conflict);
  vec<Minisat::lbool,_int>::~vec(&this->model);
  return;
}

Assistant:

Solver::~Solver()
{
}